

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

QuantizationParams * __thiscall
CoreML::Specification::WeightParams::_internal_mutable_quantization(WeightParams *this)

{
  Arena *arena;
  QuantizationParams *pQVar1;
  QuantizationParams *p;
  WeightParams *this_local;
  
  if (this->quantization_ == (QuantizationParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pQVar1 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::QuantizationParams>(arena);
    this->quantization_ = pQVar1;
  }
  return this->quantization_;
}

Assistant:

inline ::CoreML::Specification::QuantizationParams* WeightParams::_internal_mutable_quantization() {
  
  if (quantization_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::QuantizationParams>(GetArenaForAllocation());
    quantization_ = p;
  }
  return quantization_;
}